

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O0

void hts_idx_save(hts_idx_t *idx,char *fn,int fmt)

{
  undefined8 fp_00;
  int iVar1;
  size_t sVar2;
  char *__dest;
  char *pcVar3;
  void *data;
  BGZF *fp_01;
  FILE *__s;
  FILE *fp_2;
  BGZF *fp_1;
  int i;
  int is_be;
  uint32_t x [3];
  BGZF *fp;
  char *fnidx;
  int fmt_local;
  char *fn_local;
  hts_idx_t *idx_local;
  
  sVar2 = strlen(fn);
  __dest = (char *)calloc(1,sVar2 + 5);
  strcpy(__dest,fn);
  if (fmt == 0) {
    iVar1 = ed_is_big();
    pcVar3 = strcat(__dest,".csi");
    x._4_8_ = bgzf_open(pcVar3,"w");
    bgzf_write((BGZF *)x._4_8_,"CSI\x01",4);
    i = idx->min_shift;
    is_be = idx->n_lvls;
    x[0] = idx->l_meta;
    if (iVar1 == 0) {
      bgzf_write((BGZF *)x._4_8_,&i,0xc);
    }
    else {
      for (fp_1._4_4_ = 0; fp_00 = x._4_8_, fp_1._4_4_ < 3; fp_1._4_4_ = fp_1._4_4_ + 1) {
        data = ed_swap_4p(&i + fp_1._4_4_);
        bgzf_write((BGZF *)fp_00,data,4);
      }
    }
    if (idx->l_meta != 0) {
      bgzf_write((BGZF *)x._4_8_,idx->meta,(ulong)idx->l_meta);
    }
    hts_idx_save_core(idx,(void *)x._4_8_,0);
    bgzf_close((BGZF *)x._4_8_);
  }
  else if (fmt == 2) {
    pcVar3 = strcat(__dest,".tbi");
    fp_01 = bgzf_open(pcVar3,"w");
    bgzf_write(fp_01,"TBI\x01",4);
    hts_idx_save_core(idx,fp_01,2);
    bgzf_close(fp_01);
  }
  else {
    if (fmt != 1) {
      abort();
    }
    pcVar3 = strcat(__dest,".bai");
    __s = fopen(pcVar3,"w");
    fwrite("BAI\x01",1,4,__s);
    hts_idx_save_core(idx,__s,1);
    fclose(__s);
  }
  free(__dest);
  return;
}

Assistant:

void hts_idx_save(const hts_idx_t *idx, const char *fn, int fmt)
{
    char *fnidx;
    fnidx = (char*)calloc(1, strlen(fn) + 5);
    strcpy(fnidx, fn);
    if (fmt == HTS_FMT_CSI) {
        BGZF *fp;
        uint32_t x[3];
        int is_be, i;
        is_be = ed_is_big();
        fp = bgzf_open(strcat(fnidx, ".csi"), "w");
        bgzf_write(fp, "CSI\1", 4);
        x[0] = idx->min_shift; x[1] = idx->n_lvls; x[2] = idx->l_meta;
        if (is_be) {
            for (i = 0; i < 3; ++i)
                bgzf_write(fp, ed_swap_4p(&x[i]), 4);
        } else bgzf_write(fp, &x, 12);
        if (idx->l_meta) bgzf_write(fp, idx->meta, idx->l_meta);
        hts_idx_save_core(idx, fp, HTS_FMT_CSI);
        bgzf_close(fp);
    } else if (fmt == HTS_FMT_TBI) {
        BGZF *fp;
        fp = bgzf_open(strcat(fnidx, ".tbi"), "w");
        bgzf_write(fp, "TBI\1", 4);
        hts_idx_save_core(idx, fp, HTS_FMT_TBI);
        bgzf_close(fp);
    } else if (fmt == HTS_FMT_BAI) {
        FILE *fp;
        fp = fopen(strcat(fnidx, ".bai"), "w");
        fwrite("BAI\1", 1, 4, fp);
        hts_idx_save_core(idx, fp, HTS_FMT_BAI);
        fclose(fp);
    } else abort();
    free(fnidx);
}